

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strnlen_s.c
# Opt level: O2

rsize_t strnlen_s(char *dest,rsize_t dmax)

{
  errno_t error;
  rsize_t rVar1;
  char *msg;
  
  if (dest != (char *)0x0) {
    if (dmax == 0) {
      msg = "strnlen_s: dmax is 0";
      error = 0x191;
    }
    else {
      if (dmax < 0x1001) {
        rVar1 = 0;
        while( true ) {
          if (dest[rVar1] == '\0') {
            return rVar1;
          }
          if (dmax == rVar1) break;
          rVar1 = rVar1 + 1;
        }
        return rVar1;
      }
      msg = "strnlen_s: dmax exceeds max";
      error = 0x193;
    }
    invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  }
  return 0;
}

Assistant:

rsize_t
strnlen_s (const char *dest, rsize_t dmax)
{
    rsize_t count;

    if (dest == NULL) {
        return RCNEGATE(0);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(0);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(0);
    }

    count = 0;
    while (*dest && dmax) {
        count++;
        dmax--;
        dest++;
    }

    return RCNEGATE(count);
}